

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

space_info * ghc::filesystem::space(space_info *__return_storage_ptr__,path *p,error_code *ec)

{
  int iVar1;
  error_category *peVar2;
  int *piVar3;
  statvfs sfs;
  statvfs local_90;
  
  peVar2 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar2;
  iVar1 = statvfs((p->_path)._M_dataplus._M_p,&local_90);
  if (iVar1 == 0) {
    __return_storage_ptr__->capacity = local_90.f_blocks * local_90.f_frsize;
    __return_storage_ptr__->free = local_90.f_bfree * local_90.f_frsize;
    __return_storage_ptr__->available = local_90.f_frsize * local_90.f_bavail;
  }
  else {
    piVar3 = __errno_location();
    ec->_M_value = *piVar3;
    ec->_M_cat = peVar2;
    *(undefined4 *)&__return_storage_ptr__->capacity = 0xffffffff;
    *(undefined4 *)((long)&__return_storage_ptr__->capacity + 4) = 0xffffffff;
    *(undefined4 *)&__return_storage_ptr__->free = 0xffffffff;
    *(undefined4 *)((long)&__return_storage_ptr__->free + 4) = 0xffffffff;
    __return_storage_ptr__->available = 0xffffffffffffffff;
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE space_info space(const path& p, std::error_code& ec) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    ULARGE_INTEGER freeBytesAvailableToCaller = {{ 0, 0 }};
    ULARGE_INTEGER totalNumberOfBytes = {{ 0, 0 }};
    ULARGE_INTEGER totalNumberOfFreeBytes = {{ 0, 0 }};
    if (!GetDiskFreeSpaceExW(GHC_NATIVEWP(p), &freeBytesAvailableToCaller, &totalNumberOfBytes, &totalNumberOfFreeBytes)) {
        ec = detail::make_system_error();
        return {static_cast<uintmax_t>(-1), static_cast<uintmax_t>(-1), static_cast<uintmax_t>(-1)};
    }
    return {static_cast<uintmax_t>(totalNumberOfBytes.QuadPart), static_cast<uintmax_t>(totalNumberOfFreeBytes.QuadPart), static_cast<uintmax_t>(freeBytesAvailableToCaller.QuadPart)};
#else
    struct ::statvfs sfs;
    if (::statvfs(p.c_str(), &sfs) != 0) {
        ec = detail::make_system_error();
        return {static_cast<uintmax_t>(-1), static_cast<uintmax_t>(-1), static_cast<uintmax_t>(-1)};
    }
    return {static_cast<uintmax_t>(sfs.f_blocks * sfs.f_frsize), static_cast<uintmax_t>(sfs.f_bfree * sfs.f_frsize), static_cast<uintmax_t>(sfs.f_bavail * sfs.f_frsize)};
#endif
}